

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_delimgetref.cpp
# Opt level: O3

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind(Binder *this,DelimGetRef *ref)

{
  bool bVar1;
  char cVar2;
  idx_t __val;
  long *plVar3;
  element_type *this_00;
  idx_t iVar4;
  size_type *psVar5;
  long in_RDX;
  char cVar6;
  string internal_name;
  string __str;
  string local_70;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  __val = GenerateTableIndex((Binder *)ref);
  cVar6 = '\x01';
  if (9 < __val) {
    iVar4 = __val;
    cVar2 = '\x04';
    do {
      cVar6 = cVar2;
      if (iVar4 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_011dd150;
      }
      if (iVar4 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_011dd150;
      }
      if (iVar4 < 10000) goto LAB_011dd150;
      bVar1 = 99999 < iVar4;
      iVar4 = iVar4 / 10000;
      cVar2 = cVar6 + '\x04';
    } while (bVar1);
    cVar6 = cVar6 + '\x01';
  }
LAB_011dd150:
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct((ulong)&local_50,cVar6);
  ::std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,__val);
  plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1de65e7);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_70.field_2._M_allocated_capacity = *psVar5;
    local_70.field_2._8_8_ = plVar3[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar5;
    local_70._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_70._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  BindContext::AddGenericBinding
            ((BindContext *)
             &(ref->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish,__val,&local_70,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)(in_RDX + 0x68),(vector<duckdb::LogicalType,_true> *)(in_RDX + 0x80));
  this_00 = (element_type *)operator_new(0x38);
  BoundDelimGetRef::BoundDelimGetRef
            ((BoundDelimGetRef *)this_00,__val,(vector<duckdb::LogicalType,_true> *)(in_RDX + 0x80))
  ;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(DelimGetRef &ref) {
	// Have to add bindings
	idx_t tbl_idx = GenerateTableIndex();
	string internal_name = "__internal_delim_get_ref_" + std::to_string(tbl_idx);
	bind_context.AddGenericBinding(tbl_idx, internal_name, ref.internal_aliases, ref.types);

	return make_uniq<BoundDelimGetRef>(tbl_idx, ref.types);
}